

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::LoadArena(Map *this)

{
  World *pWVar1;
  Character *this_00;
  Map *pMVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  list<Character_*,_std::allocator<Character_*>_> *this_01;
  mapped_type *pmVar6;
  size_type sVar7;
  Arena *pAVar8;
  reference pbVar9;
  reference ppCVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int subject;
  int subject_00;
  int subject_01;
  Character *character_1;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> spawn;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Arena_Spawn *s;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  spawns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string spawns_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Character *local_48;
  Character *character;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  list<Character_*,_std::allocator<Character_*>_> update_characters;
  Map *this_local;
  
  update_characters.super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
  _M_size = (size_t)this;
  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::list
            ((list<Character_*,_std::allocator<Character_*>_> *)&__range2);
  iVar4 = extraout_EDX;
  if (this->arena != (Arena *)0x0) {
    this_01 = &this->arena->map->characters;
    __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_01);
    character = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_01);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&character), bVar3) {
      ppCVar10 = std::_List_iterator<Character_*>::operator*(&__end2);
      local_48 = *ppCVar10;
      if (local_48->arena == this->arena) {
        std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::push_back
                  ((list<Character_*,_std::allocator<Character_*>_> *)&__range2,&local_48);
      }
      std::_List_iterator<Character_*>::operator++(&__end2);
    }
    pAVar8 = this->arena;
    iVar4 = extraout_EDX_00;
    if (pAVar8 != (Arena *)0x0) {
      Arena::~Arena(pAVar8);
      operator_delete(pAVar8,0x38);
      iVar4 = extraout_EDX_01;
    }
  }
  pWVar1 = this->world;
  util::to_string_abi_cxx11_
            ((string *)((long)&spawns_str.field_2 + 8),(util *)(ulong)(uint)(int)this->id,iVar4);
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&spawns_str.field_2 + 8),".enabled");
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->arenas_config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_78);
  bVar3 = util::variant::operator_cast_to_bool(pmVar6);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)(spawns_str.field_2._M_local_buf + 8));
  if (bVar3) {
    pWVar1 = this->world;
    util::to_string_abi_cxx11_
              ((string *)
               &spawns.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (util *)(ulong)(uint)(int)this->id,subject);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &spawns.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,".spawns");
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->arenas_config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_d8);
    util::variant::operator_cast_to_string((string *)local_b8,pmVar6);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string
              ((string *)
               &spawns.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_110,',',(string *)local_b8);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_110);
    if ((sVar7 & 3) == 0) {
      pAVar8 = (Arena *)operator_new(0x38);
      s._7_1_ = 1;
      pWVar1 = this->world;
      util::to_string_abi_cxx11_(&local_150,(util *)(ulong)(uint)(int)this->id,subject_00);
      std::operator+(&local_130,&local_150,".time");
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->arenas_config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_130);
      iVar4 = util::variant::operator_cast_to_int(pmVar6);
      pWVar1 = this->world;
      util::to_string_abi_cxx11_((string *)&i,(util *)(ulong)(uint)(int)this->id,subject_01);
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     ".block");
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->arenas_config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_170);
      iVar5 = util::variant::operator_cast_to_int(pmVar6);
      Arena::Arena(pAVar8,this,iVar4,iVar5);
      s._7_1_ = 0;
      this->arena = pAVar8;
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      sVar7 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::size
                        ((list<Character_*,_std::allocator<Character_*>_> *)&__range2);
      this->arena->occupants = (int)sVar7;
      s._0_4_ = 1;
      __range3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_110);
      spawn.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_110);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&spawn.field_2 + 8)), bVar3) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        std::__cxx11::string::string((string *)local_1d8,(string *)pbVar9);
        util::trim((string *)&__range1,(string *)local_1d8);
        std::__cxx11::string::~string((string *)&__range1);
        iVar5 = (int)s + 1;
        iVar4 = (int)s % 4;
        s._0_4_ = iVar5;
        switch(iVar4) {
        case 0:
          iVar4 = util::to_int((string *)local_1d8);
          *(char *)((long)&(__range3->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 3) = (char)iVar4;
          std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>::push_back
                    (&this->arena->spawns,(value_type *)&__range3);
          __range3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x0;
          break;
        case 1:
          __range3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)operator_new(4);
          iVar4 = util::to_int((string *)local_1d8);
          *(char *)&(__range3->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start = (char)iVar4;
          break;
        case 2:
          iVar4 = util::to_int((string *)local_1d8);
          *(char *)((long)&(__range3->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1) = (char)iVar4;
          break;
        case 3:
          iVar4 = util::to_int((string *)local_1d8);
          *(char *)((long)&(__range3->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 2) = (char)iVar4;
        }
        std::__cxx11::string::~string((string *)local_1d8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      if ((__range3 !=
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) &&
         (Console::Wrn("Invalid arena spawn string"),
         __range3 !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0)) {
        operator_delete(__range3,4);
      }
    }
    else {
      Console::Wrn("Invalid arena spawn data for map %i",(ulong)(uint)(int)this->id);
      this->arena = (Arena *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_110);
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    this->arena = (Arena *)0x0;
  }
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                     ((list<Character_*,_std::allocator<Character_*>_> *)&__range2);
  character_1 = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                          ((list<Character_*,_std::allocator<Character_*>_> *)&__range2);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&character_1), bVar3) {
    ppCVar10 = std::_List_iterator<Character_*>::operator*(&__end1);
    this_00 = *ppCVar10;
    this_00->arena = this->arena;
    if (this->arena == (Arena *)0x0) {
      pMVar2 = this_00->map;
      Character::Warp(this_00,pMVar2->id,pMVar2->relog_x,pMVar2->relog_y,WARP_ANIMATION_NONE);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::~list
            ((list<Character_*,_std::allocator<Character_*>_> *)&__range2);
  return;
}

Assistant:

void Map::LoadArena()
{
	std::list<Character *> update_characters;

	if (this->arena)
	{
		UTIL_FOREACH(this->arena->map->characters, character)
		{
			if (character->arena == this->arena)
			{
				update_characters.push_back(character);
			}
		}

		delete this->arena;
	}

	if (world->arenas_config[util::to_string(id) + ".enabled"])
	{
		std::string spawns_str = world->arenas_config[util::to_string(id) + ".spawns"];

		std::vector<std::string> spawns = util::explode(',', spawns_str);

		if (spawns.size() % 4 != 0)
		{
			Console::Wrn("Invalid arena spawn data for map %i", id);
			this->arena = 0;
		}
		else
		{
			this->arena = new Arena(this, static_cast<int>(world->arenas_config[util::to_string(id) + ".time"]), static_cast<int>(world->arenas_config[util::to_string(id) + ".block"]));
			this->arena->occupants = update_characters.size();

			int i = 1;
			Arena_Spawn *s = 0;
			UTIL_FOREACH(spawns, spawn)
			{
				util::trim(spawn);

				switch (i++ % 4)
				{
					case 1:
						s = new Arena_Spawn;
						s->sx = util::to_int(spawn);
						break;

					case 2:
						s->sy = util::to_int(spawn);
						break;

					case 3:
						s->dx = util::to_int(spawn);
						break;

					case 0:
						s->dy = util::to_int(spawn);
						this->arena->spawns.push_back(s);
						s = 0;
						break;
				}
			}

			if (s)
			{
				Console::Wrn("Invalid arena spawn string");
				delete s;
			}
		}
	}
	else
	{
		this->arena = 0;
	}

	UTIL_FOREACH(update_characters, character)
	{
		character->arena = this->arena;

		if (!this->arena)
		{
			character->Warp(character->map->id, character->map->relog_x, character->map->relog_y);
		}
	}
}